

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

Clu_Man_t *
Fra_ClausAlloc(Aig_Man_t *pAig,int nFrames,int nPref,int nClausesMax,int nLutSize,int nLevels,
              int nCutsMax,int nBatches,int fStepUp,int fTarget,int fVerbose,int fVeryVerbose)

{
  Clu_Man_t *pCVar1;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *vInfo;
  
  pCVar1 = (Clu_Man_t *)calloc(1,0xb8);
  pCVar1->pAig = pAig;
  pCVar1->nFrames = nFrames;
  pCVar1->nPref = nPref;
  pCVar1->nClausesMax = nClausesMax;
  pCVar1->nLutSize = nLutSize;
  pCVar1->nLevels = nLevels;
  pCVar1->nCutsMax = nCutsMax;
  pCVar1->nBatches = nBatches;
  pCVar1->fStepUp = fStepUp;
  pCVar1->fTarget = fTarget;
  pCVar1->fVerbose = fVerbose;
  pCVar1->fVeryVerbose = fVeryVerbose;
  pCVar1->nSimWords = 0x200;
  pCVar1->nSimFrames = 0x20;
  pCVar1->nSimWordsPref = nPref << 4;
  pVVar2 = Vec_IntAlloc(0x4000);
  pCVar1->vLits = pVVar2;
  pVVar2 = Vec_IntAlloc(0x1000);
  pCVar1->vClauses = pVVar2;
  pVVar2 = Vec_IntAlloc(0x1000);
  pCVar1->vCosts = pVVar2;
  pVVar2 = Vec_IntAlloc(0x4000);
  pCVar1->vLitsProven = pVVar2;
  pVVar2 = Vec_IntAlloc(0x1000);
  pCVar1->vClausesProven = pVVar2;
  pCVar1->nCexesAlloc = 0x400;
  vInfo = Vec_PtrAllocSimInfo(pAig->vObjs->nSize + 1,0x20);
  pCVar1->vCexes = vInfo;
  Vec_PtrCleanSimInfo(vInfo,0,0x20);
  return pCVar1;
}

Assistant:

Clu_Man_t * Fra_ClausAlloc( Aig_Man_t * pAig, int nFrames, int nPref, int nClausesMax, int nLutSize, int nLevels, int nCutsMax, int nBatches, int fStepUp, int fTarget, int fVerbose, int fVeryVerbose )
{
    Clu_Man_t * p;
    p = ABC_ALLOC( Clu_Man_t, 1 );
    memset( p, 0, sizeof(Clu_Man_t) );
    p->pAig          = pAig;
    p->nFrames       = nFrames;
    p->nPref         = nPref;
    p->nClausesMax   = nClausesMax;
    p->nLutSize      = nLutSize;
    p->nLevels       = nLevels;
    p->nCutsMax      = nCutsMax;
    p->nBatches      = nBatches;
    p->fStepUp       = fStepUp;
    p->fTarget       = fTarget;
    p->fVerbose      = fVerbose;
    p->fVeryVerbose  = fVeryVerbose;
    p->nSimWords     = 512;//1024;//64;
    p->nSimFrames    = 32;//8;//32;
    p->nSimWordsPref = p->nPref*p->nSimWords/p->nSimFrames;

    p->vLits         = Vec_IntAlloc( 1<<14 );
    p->vClauses      = Vec_IntAlloc( 1<<12 );
    p->vCosts        = Vec_IntAlloc( 1<<12 );

    p->vLitsProven   = Vec_IntAlloc( 1<<14 );
    p->vClausesProven= Vec_IntAlloc( 1<<12 );

    p->nCexesAlloc   = 1024;
    p->vCexes        = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(p->pAig)+1, p->nCexesAlloc/32 );
    Vec_PtrCleanSimInfo( p->vCexes, 0, p->nCexesAlloc/32 );
    return p;
}